

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman.cpp
# Opt level: O0

void __thiscall
KalmanFilter::KalmanFilter
          (KalmanFilter *this,double dt,MatrixXd *A,MatrixXd *C,MatrixXd *Q,MatrixXd *R,MatrixXd *P)

{
  Index IVar1;
  MatrixXd *P_local;
  MatrixXd *R_local;
  MatrixXd *Q_local;
  MatrixXd *C_local;
  MatrixXd *A_local;
  double dt_local;
  KalmanFilter *this_local;
  
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->A,A);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->C,C);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Q,Q);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->R,R);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->P);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->K);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->P0,P);
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&C->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  this->m = (int)IVar1;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  this->n = (int)IVar1;
  this->dt = dt;
  this->initialized = false;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->I,&this->n,&this->n);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->x_hat,&this->n);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->x_hat_new,&this->n);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->I);
  return;
}

Assistant:

KalmanFilter::KalmanFilter(
	double dt,
	const Eigen::MatrixXd& A,
	const Eigen::MatrixXd& C,
	const Eigen::MatrixXd& Q,
	const Eigen::MatrixXd& R,
	const Eigen::MatrixXd& P)
	: A(A), C(C), Q(Q), R(R), P0(P),
      m(C.rows()), n(A.rows()), dt(dt), initialized(false),
      I(n, n), x_hat(n), x_hat_new(n)
{
  I.setIdentity();
}